

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

re_t re_compile(char *pattern)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_28;
  int buf_begin;
  int j;
  int i;
  char c;
  int ccl_bufidx;
  char *pattern_local;
  
  i = 1;
  buf_begin = 0;
  local_28 = 0;
  do {
    iVar2 = i;
    if (pattern[buf_begin] == '\0' || 0x1d < local_28 + 1) {
      re_compile::re_compiled[local_28].type = '\0';
      pattern_local = (char *)re_compile::re_compiled;
      return (re_t)pattern_local;
    }
    uVar1 = pattern[buf_begin];
    switch(uVar1) {
    case '$':
      re_compile::re_compiled[local_28].type = '\x03';
      break;
    default:
      re_compile::re_compiled[local_28].type = '\a';
      re_compile::re_compiled[local_28].field_1.ch = uVar1;
      break;
    case '*':
      re_compile::re_compiled[local_28].type = '\x05';
      break;
    case '+':
      re_compile::re_compiled[local_28].type = '\x06';
      break;
    case '.':
      re_compile::re_compiled[local_28].type = '\x01';
      break;
    case '?':
      re_compile::re_compiled[local_28].type = '\x04';
      break;
    case '[':
      if (pattern[buf_begin + 1] == '^') {
        re_compile::re_compiled[local_28].type = '\t';
        buf_begin = buf_begin + 1;
      }
      else {
        re_compile::re_compiled[local_28].type = '\b';
      }
      while( true ) {
        iVar3 = buf_begin + 1;
        bVar4 = false;
        if (pattern[iVar3] != ']') {
          bVar4 = pattern[iVar3] != '\0';
        }
        if (!bVar4) break;
        if (pattern[iVar3] == '\\') {
          if (0x26 < i) {
            return (re_t)0x0;
          }
          re_compile::ccl_buf[i] = pattern[iVar3];
          buf_begin = buf_begin + 2;
          i = i + 1;
        }
        else {
          buf_begin = iVar3;
          if (0x27 < i) {
            return (re_t)0x0;
          }
        }
        re_compile::ccl_buf[i] = pattern[buf_begin];
        i = i + 1;
      }
      if (0x27 < i) {
        return (re_t)0x0;
      }
      re_compile::ccl_buf[i] = '\0';
      re_compile::re_compiled[local_28].field_1.ccl = re_compile::ccl_buf + iVar2;
      buf_begin = iVar3;
      i = i + 1;
      break;
    case '\\':
      if (pattern[buf_begin + 1] != '\0') {
        buf_begin = buf_begin + 1;
        switch(pattern[buf_begin]) {
        case 'D':
          re_compile::re_compiled[local_28].type = '\v';
          break;
        default:
          re_compile::re_compiled[local_28].type = '\a';
          re_compile::re_compiled[local_28].field_1.ch = pattern[buf_begin];
          break;
        case 'S':
          re_compile::re_compiled[local_28].type = '\x0f';
          break;
        case 'W':
          re_compile::re_compiled[local_28].type = '\r';
          break;
        case 'd':
          re_compile::re_compiled[local_28].type = '\n';
          break;
        case 's':
          re_compile::re_compiled[local_28].type = '\x0e';
          break;
        case 'w':
          re_compile::re_compiled[local_28].type = '\f';
        }
      }
      break;
    case '^':
      re_compile::re_compiled[local_28].type = '\x02';
    }
    buf_begin = buf_begin + 1;
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

re_t re_compile(const char* pattern)
{
  /* The sizes of the two static arrays below substantiates the static RAM usage of this module.
     MAX_REGEXP_OBJECTS is the max number of symbols in the expression.
     MAX_CHAR_CLASS_LEN determines the size of buffer for chars in all char-classes in the expression. */
  static regex_t re_compiled[MAX_REGEXP_OBJECTS];
  static unsigned char ccl_buf[MAX_CHAR_CLASS_LEN];
  int ccl_bufidx = 1;

  char c;     /* current char in pattern   */
  int i = 0;  /* index into pattern        */
  int j = 0;  /* index into re_compiled    */

  while (pattern[i] != '\0' && (j+1 < MAX_REGEXP_OBJECTS))
  {
    c = pattern[i];

    switch (c)
    {
      /* Meta-characters: */
      case '^': {    re_compiled[j].type = BEGIN;           } break;
      case '$': {    re_compiled[j].type = END;             } break;
      case '.': {    re_compiled[j].type = DOT;             } break;
      case '*': {    re_compiled[j].type = STAR;            } break;
      case '+': {    re_compiled[j].type = PLUS;            } break;
      case '?': {    re_compiled[j].type = QUESTIONMARK;    } break;
/*    case '|': {    re_compiled[j].type = BRANCH;          } break; <-- not working properly */

      /* Escaped character-classes (\s \w ...): */
      case '\\':
      {
        if (pattern[i+1] != '\0')
        {
          /* Skip the escape-char '\\' */
          i += 1;
          /* ... and check the next */
          switch (pattern[i])
          {
            /* Meta-character: */
            case 'd': {    re_compiled[j].type = DIGIT;            } break;
            case 'D': {    re_compiled[j].type = NOT_DIGIT;        } break;
            case 'w': {    re_compiled[j].type = ALPHA;            } break;
            case 'W': {    re_compiled[j].type = NOT_ALPHA;        } break;
            case 's': {    re_compiled[j].type = WHITESPACE;       } break;
            case 'S': {    re_compiled[j].type = NOT_WHITESPACE;   } break;

            /* Escaped character, e.g. '.' or '$' */ 
            default:  
            {
              re_compiled[j].type = CHAR;
              re_compiled[j].ch = pattern[i];
            } break;
          }
        }
        /* '\\' as last char in pattern -> invalid regular expression. */
/*
        else
        { 
          re_compiled[j].type = CHAR;
          re_compiled[j].ch = pattern[i];
        }
*/
      } break;

      /* Character class: */
      case '[':
      {
        /* Remember where the char-buffer starts. */
        int buf_begin = ccl_bufidx;

        /* Look-ahead to determine if negated */
        if (pattern[i+1] == '^')
        {
          re_compiled[j].type = INV_CHAR_CLASS;
          i += 1; /* Increment i to avoid including '^' in the char-buffer */
        }  
        else
        {
          re_compiled[j].type = CHAR_CLASS;
        }

        /* Copy characters inside [..] to buffer */
        while (    (pattern[++i] != ']')
                && (pattern[i]   != '\0')) /* Missing ] */
        {
          if (pattern[i] == '\\')
          {
            if (ccl_bufidx >= MAX_CHAR_CLASS_LEN - 1)
            {
              //fputs("exceeded internal buffer!\n", stderr);
              return 0;
            }
            ccl_buf[ccl_bufidx++] = pattern[i++];
          }
          else if (ccl_bufidx >= MAX_CHAR_CLASS_LEN)
          {
              //fputs("exceeded internal buffer!\n", stderr);
              return 0;
          }
          ccl_buf[ccl_bufidx++] = pattern[i];
        }
        if (ccl_bufidx >= MAX_CHAR_CLASS_LEN)
        {
            /* Catches cases such as [00000000000000000000000000000000000000][ */
            //fputs("exceeded internal buffer!\n", stderr);
            return 0;
        }
        /* Null-terminate string end */
        ccl_buf[ccl_bufidx++] = 0;
        re_compiled[j].ccl = &ccl_buf[buf_begin];
      } break;

      /* Other characters: */
      default:
      {
        re_compiled[j].type = CHAR;
        re_compiled[j].ch = c;
      } break;
    }
    i += 1;
    j += 1;
  }
  /* 'UNUSED' is a sentinel used to indicate end-of-pattern */
  re_compiled[j].type = UNUSED;

  return (re_t) re_compiled;
}